

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt.cc
# Opt level: O0

bool __thiscall re2c::Opt::source(Opt *this,char *s)

{
  bool bVar1;
  char *s_local;
  Opt *this_local;
  
  bVar1 = this->source_file == (char *)0x0;
  if (bVar1) {
    this->source_file = s;
  }
  else {
    error("multiple source files: %s, %s",this->source_file,s);
  }
  return bVar1;
}

Assistant:

bool Opt::source (const char * s)
{
	if (source_file)
	{
		error ("multiple source files: %s, %s", source_file, s);
		return false;
	}
	else
	{
		source_file = s;
		return true;
	}
}